

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  long *local_c0;
  size_type local_b8;
  long local_b0 [2];
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  size_type local_50;
  long *local_48;
  undefined8 local_40;
  char *local_38;
  
  puVar1 = *(undefined8 **)this;
  uVar2 = *(undefined8 *)(**(long **)(this + 8) + 0x150);
  uVar3 = *(undefined8 *)(**(long **)(this + 8) + 0x158);
  uVar4 = *puVar1;
  uVar5 = puVar1[1];
  std::__cxx11::string::substr((ulong)&local_c0,(ulong)puVar1);
  local_a0 = 8;
  local_98 = "Option \"";
  local_80 = 0x13;
  local_78 = "\" is resolved to \"(";
  local_60 = 0x7a;
  local_58 = 
  ")\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"(."
  ;
  local_50 = local_b8;
  local_48 = local_c0;
  local_40 = 0x25;
  local_38 = "\") to start from the outermost scope.";
  pieces._M_len = local_b8;
  pieces._M_array = (iterator)0x7;
  local_90 = uVar5;
  local_88 = uVar4;
  local_70 = uVar3;
  local_68 = uVar2;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_a0,pieces);
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}